

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O2

void R_AddLine(seg_t *line)

{
  vertex_t *pvVar1;
  vertex_t *pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  short sVar9;
  bool bVar10;
  bool bVar11;
  short sVar12;
  int iVar13;
  short sVar14;
  int iVar15;
  vertex_t *pvVar16;
  SWORD *b2_1;
  subsector_t *psVar17;
  uint uVar18;
  line_t *line_00;
  SWORD *b2;
  ulong uVar19;
  DVector2 local_88;
  DVector2 local_78;
  DVector2 local_68;
  DVector2 local_58;
  DVector2 local_48;
  
  if ((R_AddLine(seg_t*)::tempsec == '\0') &&
     (iVar13 = __cxa_guard_acquire(&R_AddLine(seg_t*)::tempsec), iVar13 != 0)) {
    __cxa_guard_release(&R_AddLine(seg_t*)::tempsec);
  }
  dVar8 = ViewPos.Y;
  dVar7 = ViewPos.X;
  dc_color = (int)(((long)line - (long)segs) / 0x48) * 8 + 4U & 0xff;
  dVar3 = (line->v1->p).X;
  dVar4 = (line->v1->p).Y;
  local_78.X = dVar3 - ViewPos.X;
  local_78.Y = dVar4 - ViewPos.Y;
  dVar5 = (line->v2->p).X;
  dVar6 = (line->v2->p).Y;
  local_88.X = dVar5 - ViewPos.X;
  local_88.Y = dVar6 - ViewPos.Y;
  if (0.0 <= (dVar3 - dVar5) * local_78.Y + (dVar6 - dVar4) * local_78.X) {
    curline = line;
    return;
  }
  curline = line;
  bVar10 = FWallCoords::Init(&WallC,&local_78,&local_88,0.0078125);
  if (bVar10) {
    return;
  }
  if (WindowRight <= WallC.sx1) {
    return;
  }
  if (WallC.sx2 <= WindowLeft) {
    return;
  }
  line_00 = line->linedef;
  if (line_00 == (line_t *)0x0) {
    bVar10 = R_CheckClipWallSegment((int)WallC.sx1,(int)WallC.sx2);
  }
  else {
    if (CurrentPortal != (PortalDrawseg *)0x0 && CurrentPortalInSkybox == false) {
      local_48.X = dVar7;
      local_48.Y = dVar8;
      bVar10 = P_ClipLineToPortal(line_00,CurrentPortal->dst,&local_48,true,true);
      if (bVar10) {
        return;
      }
      line_00 = line->linedef;
    }
    pvVar1 = line_00->v1;
    pvVar2 = line_00->v2;
    if (((pvVar1 == line->v1) && (pvVar2 == line->v2)) ||
       ((pvVar2 == line->v1 && (pvVar1 == line->v2)))) {
      FWallTmapVals::InitFromWallCoords(&WallT,&WallC);
    }
    else {
      pvVar16 = pvVar2;
      if (line_00->sidedef[0] == line->sidedef) {
        pvVar16 = pvVar1;
        pvVar1 = pvVar2;
      }
      local_58.X = (pvVar16->p).X - ViewPos.X;
      local_58.Y = (pvVar16->p).Y - ViewPos.Y;
      local_68.X = (pvVar1->p).X - ViewPos.X;
      local_68.Y = (pvVar1->p).Y - ViewPos.Y;
      FWallTmapVals::InitFromLine(&WallT,&local_58,&local_68);
    }
    if ((fake3D & 4U) == 0) {
      backsector = line->backsector;
    }
    rw_frontcz1 = secplane_t::ZatPoint(&frontsector->ceilingplane,line->v1);
    rw_frontfz1 = secplane_t::ZatPoint(&frontsector->floorplane,line->v1);
    rw_frontcz2 = secplane_t::ZatPoint(&frontsector->ceilingplane,line->v2);
    rw_frontfz2 = secplane_t::ZatPoint(&frontsector->floorplane,line->v2);
    rw_mustmarkceiling = false;
    rw_mustmarkfloor = false;
    rw_havelow = false;
    rw_havehigh = false;
    bVar10 = true;
    if (backsector != (sector_t *)0x0) {
      if ((fake3D & 4U) == 0) {
        backsector = R_FakeFlat(backsector,&R_AddLine::tempsec,(int *)0x0,(int *)0x0,true);
      }
      doorclosed = 0;
      rw_backcz1 = secplane_t::ZatPoint(&backsector->ceilingplane,line->v1);
      rw_backfz1 = secplane_t::ZatPoint(&backsector->floorplane,line->v1);
      rw_backcz2 = secplane_t::ZatPoint(&backsector->ceilingplane,line->v2);
      rw_backfz2 = secplane_t::ZatPoint(&backsector->floorplane,line->v2);
      if ((fake3D & 4U) != 0) {
        if ((rw_backfz1 <= rw_frontfz1) && (rw_backfz2 <= rw_frontfz2)) {
          fake3D = fake3D | 8;
        }
        if ((rw_frontcz1 <= rw_backcz1) && (rw_frontcz2 <= rw_backcz2)) {
          fake3D = fake3D | 0x10;
        }
      }
      bVar10 = true;
      if ((rw_backcz1 < rw_frontcz1) || (rw_backcz2 < rw_frontcz2)) {
        rw_havehigh = true;
        WallMost(wallupper,&backsector->ceilingplane,&WallC);
      }
      if ((rw_frontfz1 < rw_backfz1) || (rw_frontfz2 < rw_backfz2)) {
        rw_havelow = true;
        WallMost(walllower,&backsector->floorplane,&WallC);
      }
      bVar11 = line_t::isVisualPortal(line->linedef);
      if ((((!bVar11) || (line->sidedef != line->linedef->sidedef[0])) &&
          ((rw_frontfz1 < rw_backcz1 || (rw_frontfz2 < rw_backcz2)))) &&
         ((rw_backfz1 < rw_frontcz1 || (rw_backfz2 < rw_frontcz2)))) {
        iVar13 = backsector->planes[1].Texture.texnum;
        if (((((iVar13 == skyflatnum.texnum) && (frontsector->planes[1].Texture.texnum == iVar13))
             || ((rw_backfz1 < rw_backcz1 || (rw_backfz2 < rw_backcz2)))) ||
            (((rw_backcz1 < rw_frontcz1 || (rw_backcz2 < rw_frontcz2)) &&
             (line->sidedef->textures[0].texture.texnum < 1)))) ||
           (((rw_frontfz1 < rw_backfz1 || (rw_frontfz2 < rw_backfz2)) &&
            (line->sidedef->textures[2].texture.texnum < 1)))) {
          bVar10 = secplane_t::operator!=(&frontsector->ceilingplane,&backsector->ceilingplane);
          if (((((!bVar10) &&
                (bVar10 = secplane_t::operator!=(&frontsector->floorplane,&backsector->floorplane),
                !bVar10)) &&
               ((bVar10 = R_SkyboxCompare(frontsector,backsector), !bVar10 &&
                ((backsector->lightlevel == frontsector->lightlevel &&
                 (backsector->planes[0].Texture.texnum == frontsector->planes[0].Texture.texnum)))))
               ) && ((backsector->planes[1].Texture.texnum == frontsector->planes[1].Texture.texnum
                     && (((((curline->sidedef->textures[1].texture.texnum < 1 &&
                            (bVar10 = FTransform::operator!=
                                                ((FTransform *)backsector,(FTransform *)frontsector)
                            , !bVar10)) &&
                           (bVar10 = FTransform::operator!=
                                               (&backsector->planes[1].xform,
                                                &frontsector->planes[1].xform),
                           psVar17 = InSubsector, !bVar10)) &&
                          ((backsector->planes[0].Light == frontsector->planes[0].Light &&
                           (backsector->planes[1].Light == frontsector->planes[1].Light)))) &&
                         ((((frontsector->planes[0].Flags ^ backsector->planes[0].Flags) &
                           0xfffffecdU) == 0 &&
                          ((((frontsector->planes[1].Flags ^ backsector->planes[1].Flags) &
                            0xfffffecdU) == 0 && (backsector->ColorMap == frontsector->ColorMap)))))
                         ))))) &&
             (((frontsector->e == (extsector_t *)0x0 ||
               ((frontsector->e->XFloor).lightlist.Count == 0)) &&
              ((backsector->e == (extsector_t *)0x0 ||
               ((backsector->e->XFloor).lightlist.Count == 0)))))) {
            if (hasglnodes != true) {
              return;
            }
            uVar18 = InSubsector->flags;
            if ((uVar18 & 2) != 0) {
              return;
            }
            bVar10 = R_CheckClipWallSegment((int)WallC.sx1,(int)WallC.sx2);
            if (!bVar10) {
              return;
            }
            goto LAB_00325cee;
          }
          bVar10 = false;
        }
        else {
          doorclosed = 1;
        }
      }
    }
    sVar9 = (short)centery;
    sVar14 = WallC.sx2;
    sVar12 = WallC.sx1;
    rw_prepped = false;
    if (line->linedef->special == 9) {
      iVar13 = (int)WallC.sx1;
      iVar15 = (int)WallC.sx2;
      for (uVar19 = 0; (uint)(iVar15 - iVar13) != uVar19; uVar19 = uVar19 + 1) {
        walltop[(long)iVar13 + uVar19] = sVar9;
      }
      for (uVar19 = 0; (uint)(iVar15 - iVar13) != uVar19; uVar19 = uVar19 + 1) {
        wallbottom[(long)iVar13 + uVar19] = sVar9;
      }
    }
    else {
      rw_ceilstat = WallMost(walltop,&frontsector->ceilingplane,&WallC);
      rw_floorstat = WallMost(wallbottom,&frontsector->floorplane,&WallC);
      sVar14 = WallC.sx2;
      sVar12 = WallC.sx1;
    }
    bVar10 = R_ClipWallSegment((int)sVar12,(int)sVar14,bVar10);
  }
  if (bVar10 == false) {
    return;
  }
  uVar18 = InSubsector->flags;
  psVar17 = InSubsector;
LAB_00325cee:
  psVar17->flags = uVar18 | 2;
  return;
}

Assistant:

void R_AddLine (seg_t *line)
{
	static sector_t tempsec;	// killough 3/8/98: ceiling/water hack
	bool			solid;
	DVector2		pt1, pt2;

	curline = line;

	// [RH] Color if not texturing line
	dc_color = (((int)(line - segs) * 8) + 4) & 255;

	pt1 = line->v1->fPos() - ViewPos;
	pt2 = line->v2->fPos() - ViewPos;

	// Reject lines not facing viewer
	if (pt1.Y * (pt1.X - pt2.X) + pt1.X * (pt2.Y - pt1.Y) >= 0)
		return;

	if (WallC.Init(pt1, pt2, 32.0 / (1 << 12)))
		return;

	if (WallC.sx1 >= WindowRight || WallC.sx2 <= WindowLeft)
		return;

	if (line->linedef == NULL)
	{
		if (R_CheckClipWallSegment (WallC.sx1, WallC.sx2))
		{
			InSubsector->flags |= SSECF_DRAWN;
		}
		return;
	}

	// reject lines that aren't seen from the portal (if any)
	// [ZZ] 10.01.2016: lines inside a skybox shouldn't be clipped, although this imposes some limitations on portals in skyboxes.
	if (!CurrentPortalInSkybox && CurrentPortal && P_ClipLineToPortal(line->linedef, CurrentPortal->dst, ViewPos))
		return;

	vertex_t *v1, *v2;
	v1 = line->linedef->v1;
	v2 = line->linedef->v2;

	if ((v1 == line->v1 && v2 == line->v2) || (v2 == line->v1 && v1 == line->v2))
	{ // The seg is the entire wall.
		WallT.InitFromWallCoords(&WallC);
	}
	else
	{ // The seg is only part of the wall.
		if (line->linedef->sidedef[0] != line->sidedef)
		{
			swapvalues (v1, v2);
		}
		WallT.InitFromLine(v1->fPos() - ViewPos, v2->fPos() - ViewPos);
	}

	if (!(fake3D & FAKE3D_FAKEBACK))
	{
		backsector = line->backsector;
	}
	rw_frontcz1 = frontsector->ceilingplane.ZatPoint(line->v1);
	rw_frontfz1 = frontsector->floorplane.ZatPoint(line->v1);
	rw_frontcz2 = frontsector->ceilingplane.ZatPoint(line->v2);
	rw_frontfz2 = frontsector->floorplane.ZatPoint(line->v2);

	rw_mustmarkfloor = rw_mustmarkceiling = false;
	rw_havehigh = rw_havelow = false;

	// Single sided line?
	if (backsector == NULL)
	{
		solid = true;
	}
	else
	{
		// kg3D - its fake, no transfer_heights
		if (!(fake3D & FAKE3D_FAKEBACK))
		{ // killough 3/8/98, 4/4/98: hack for invisible ceilings / deep water
			backsector = R_FakeFlat (backsector, &tempsec, NULL, NULL, true);
		}
		doorclosed = 0;		// killough 4/16/98

		rw_backcz1 = backsector->ceilingplane.ZatPoint(line->v1);
		rw_backfz1 = backsector->floorplane.ZatPoint(line->v1);
		rw_backcz2 = backsector->ceilingplane.ZatPoint(line->v2);
		rw_backfz2 = backsector->floorplane.ZatPoint(line->v2);

		if (fake3D & FAKE3D_FAKEBACK)
		{
			if (rw_frontfz1 >= rw_backfz1 && rw_frontfz2 >= rw_backfz2)
			{
				fake3D |= FAKE3D_CLIPBOTFRONT;
			}
			if (rw_frontcz1 <= rw_backcz1 && rw_frontcz2 <= rw_backcz2)
			{
				fake3D |= FAKE3D_CLIPTOPFRONT;
			}
		}

		// Cannot make these walls solid, because it can result in
		// sprite clipping problems for sprites near the wall
		if (rw_frontcz1 > rw_backcz1 || rw_frontcz2 > rw_backcz2)
		{
			rw_havehigh = true;
			WallMost (wallupper, backsector->ceilingplane, &WallC);
		}
		if (rw_frontfz1 < rw_backfz1 || rw_frontfz2 < rw_backfz2)
		{
			rw_havelow = true;
			WallMost (walllower, backsector->floorplane, &WallC);
		}

		// Portal
		if (line->linedef->isVisualPortal() && line->sidedef == line->linedef->sidedef[0])
		{
			solid = true;
		}
		// Closed door.
		else if ((rw_backcz1 <= rw_frontfz1 && rw_backcz2 <= rw_frontfz2) ||
				 (rw_backfz1 >= rw_frontcz1 && rw_backfz2 >= rw_frontcz2))
		{
			solid = true;
		}
		else if (
		// properly render skies (consider door "open" if both ceilings are sky):
		(backsector->GetTexture(sector_t::ceiling) != skyflatnum || frontsector->GetTexture(sector_t::ceiling) != skyflatnum)

		// if door is closed because back is shut:
		&& rw_backcz1 <= rw_backfz1 && rw_backcz2 <= rw_backfz2

		// preserve a kind of transparent door/lift special effect:
		&& ((rw_backcz1 >= rw_frontcz1 && rw_backcz2 >= rw_frontcz2) || line->sidedef->GetTexture(side_t::top).isValid())
		&& ((rw_backfz1 <= rw_frontfz1 && rw_backfz2 <= rw_frontfz2) || line->sidedef->GetTexture(side_t::bottom).isValid()))
		{
		// killough 1/18/98 -- This function is used to fix the automap bug which
		// showed lines behind closed doors simply because the door had a dropoff.
		//
		// It assumes that Doom has already ruled out a door being closed because
		// of front-back closure (e.g. front floor is taller than back ceiling).

		// This fixes the automap floor height bug -- killough 1/18/98:
		// killough 4/7/98: optimize: save result in doorclosed for use in r_segs.c
			doorclosed = true;
			solid = true;
		}
		else if (frontsector->ceilingplane != backsector->ceilingplane ||
			frontsector->floorplane != backsector->floorplane)
		{
		// Window.
			solid = false;
		}
		else if (R_SkyboxCompare(frontsector, backsector))
		{
			solid = false;
		}
		else if (backsector->lightlevel != frontsector->lightlevel
			|| backsector->GetTexture(sector_t::floor) != frontsector->GetTexture(sector_t::floor)
			|| backsector->GetTexture(sector_t::ceiling) != frontsector->GetTexture(sector_t::ceiling)
			|| curline->sidedef->GetTexture(side_t::mid).isValid()

			// killough 3/7/98: Take flats offsets into account:
			|| backsector->planes[sector_t::floor].xform != frontsector->planes[sector_t::floor].xform
			|| backsector->planes[sector_t::ceiling].xform != frontsector->planes[sector_t::ceiling].xform

			|| backsector->GetPlaneLight(sector_t::floor) != frontsector->GetPlaneLight(sector_t::floor)
			|| backsector->GetPlaneLight(sector_t::ceiling) != frontsector->GetPlaneLight(sector_t::ceiling)
			|| backsector->GetVisFlags(sector_t::floor) != frontsector->GetVisFlags(sector_t::floor)
			|| backsector->GetVisFlags(sector_t::ceiling) != frontsector->GetVisFlags(sector_t::ceiling)

			// [RH] Also consider colormaps
			|| backsector->ColorMap != frontsector->ColorMap



			// kg3D - and fake lights
			|| (frontsector->e && frontsector->e->XFloor.lightlist.Size())
			|| (backsector->e && backsector->e->XFloor.lightlist.Size())
			)
		{
			solid = false;
		}
		else
		{
			// Reject empty lines used for triggers and special events.
			// Identical floor and ceiling on both sides, identical light levels
			// on both sides, and no middle texture.

			// When using GL nodes, do a clipping test for these lines so we can
			// mark their subsectors as visible for automap texturing.
			if (hasglnodes && !(InSubsector->flags & SSECF_DRAWN))
			{
				if (R_CheckClipWallSegment(WallC.sx1, WallC.sx2))
				{
					InSubsector->flags |= SSECF_DRAWN;
				}
			}
			return;
		}
	}

	rw_prepped = false;

	if (line->linedef->special == Line_Horizon)
	{
		// Be aware: Line_Horizon does not work properly with sloped planes
		clearbufshort (walltop+WallC.sx1, WallC.sx2 - WallC.sx1, centery);
		clearbufshort (wallbottom+WallC.sx1, WallC.sx2 - WallC.sx1, centery);
	}
	else
	{
		rw_ceilstat = WallMost (walltop, frontsector->ceilingplane, &WallC);
		rw_floorstat = WallMost (wallbottom, frontsector->floorplane, &WallC);

		// [RH] treat off-screen walls as solid
#if 0	// Maybe later...
		if (!solid)
		{
			if (rw_ceilstat == 12 && line->sidedef->GetTexture(side_t::top) != 0)
			{
				rw_mustmarkceiling = true;
				solid = true;
			}
			if (rw_floorstat == 3 && line->sidedef->GetTexture(side_t::bottom) != 0)
			{
				rw_mustmarkfloor = true;
				solid = true;
			}
		}
#endif
	}

	if (R_ClipWallSegment (WallC.sx1, WallC.sx2, solid))
	{
		InSubsector->flags |= SSECF_DRAWN;
	}
}